

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilityTests.cpp
# Opt level: O2

void __thiscall
IndexIntervalTest_ToIndex3d_Test::~IndexIntervalTest_ToIndex3d_Test
          (IndexIntervalTest_ToIndex3d_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST_F(IndexIntervalTest, ToIndex3d)
{
    IndexInterval<Int3> interval(begin, end, step);
    int idx = 0;
    for (int i = begin.x; i < end.x; i += step.x)
    for (int j = begin.y; j < end.y; j += step.y)
    for (int k = begin.z; k < end.z; k += step.z) {
        ASSERT_EQ_INT3(Int3(i, j, k), interval.toIndex3d(idx));
        idx++;
    }
}